

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRotationGate2.hpp
# Opt level: O0

void __thiscall
qclab::qgates::QRotationGate2<std::complex<double>_>::QRotationGate2
          (QRotationGate2<std::complex<double>_> *this,int *qubits,real_type cos,real_type sin,
          bool fixed)

{
  bool fixed_local;
  real_type sin_local;
  real_type cos_local;
  int *qubits_local;
  QRotationGate2<std::complex<double>_> *this_local;
  
  QGate2<std::complex<double>_>::QGate2(&this->super_QGate2<std::complex<double>_>);
  QAdjustable::QAdjustable(&this->super_QAdjustable,fixed);
  (this->super_QGate2<std::complex<double>_>).super_QObject<std::complex<double>_>._vptr_QObject =
       (_func_int **)&PTR_nbQubits_00759d10;
  QRotation<double>::QRotation(&this->rotation_,cos,sin);
  (*(this->super_QGate2<std::complex<double>_>).super_QObject<std::complex<double>_>._vptr_QObject
    [6])(this,qubits);
  return;
}

Assistant:

QRotationGate2( const int* qubits , const real_type cos ,
                        const real_type sin , const bool fixed = false )
        : rotation_( cos , sin )
        , QAdjustable( fixed )
        {
          setQubits( qubits ) ;
        }